

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

Gia_Man_t * Sbd_ManDerive(Sbd_Man_t *pMan,Gia_Man_t *p,Vec_Int_t *vMirrors)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *p_01;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_00->pName = pcVar8;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_00->pSpec = pcVar8;
  if (p->pMuxes != (uint *)0x0) {
    puVar9 = (uint *)calloc((long)p->nObjs,4);
    p_00->pMuxes = puVar9;
  }
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00541bff;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00541be0;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00541be0;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCis;
    } while (lVar15 < pVVar11->nSize);
  }
  pVVar11 = p->vCos;
  uVar13 = (ulong)(uint)pVVar11->nSize;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      iVar12 = (int)uVar13;
      iVar1 = pVVar11->pArray[lVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00541bff;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Sbd_ManDerive_rec(p_00,p,iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff),vMirrors);
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCos;
      iVar12 = pVVar11->nSize;
      uVar13 = (ulong)iVar12;
    } while (lVar15 < (long)uVar13);
    if (0 < iVar12) {
      lVar15 = 0;
      do {
        iVar1 = pVVar11->pArray[lVar15];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00541bff:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar1;
        uVar6 = *(undefined8 *)pGVar4;
        uVar2 = pGVar4[-(ulong)((uint)uVar6 & 0x1fffffff)].Value;
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar17 = uVar2 >> 1;
        if (p_00->nObjs <= (int)uVar17) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p_00->pObjs + uVar17) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar17) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar13 | 0x80000000;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00541be0:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar14 = (ulong)(((uint)((int)pGVar10 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 &
                        0x1fffffff);
        uVar16 = (ulong)((uVar2 << 0x1d ^ (uint)uVar6) & 0x20000000);
        *(ulong *)pGVar10 = uVar16 | uVar13 & 0xffffffffc0000000 | 0x80000000 | uVar14;
        *(ulong *)pGVar10 =
             uVar16 | uVar13 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00541be0;
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                           pGVar10);
        }
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00541be0;
        pGVar4->Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
        lVar15 = lVar15 + 1;
        pVVar11 = p->vCos;
      } while (lVar15 < pVVar11->nSize);
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManTransferTiming(p_00,p);
  if (pMan->pPars->fMapping != 0) {
    Sbd_ManDeriveMapping(pMan,p_00);
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManTransferTiming(p_01,p_00);
  Gia_ManTransferMapping(p_01,p_00);
  Gia_ManStop(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Sbd_ManDerive( Sbd_Man_t * pMan, Gia_Man_t * p, Vec_Int_t * vMirrors )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId0p(p, pObj), vMirrors );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManTransferTiming( pNew, p );
    if ( pMan->pPars->fMapping )
        Sbd_ManDeriveMapping( pMan, pNew );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManTransferMapping( pNew, pTemp );
    Gia_ManStop( pTemp );
    return pNew;
}